

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf-decoder.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  runtime_error *this;
  anon_unknown_dwarf_56ca *this_00;
  char *pcVar4;
  char *filename_00;
  string *indent;
  exception *ex;
  string local_c8 [32];
  string local_a8;
  undefined1 local_88 [8];
  string buffer;
  allocator local_51;
  undefined1 local_50 [8];
  string filename;
  int remaining_args;
  int c;
  size_t length;
  size_t offset;
  char **argv_local;
  int argc_local;
  
  length = 0;
  _remaining_args = std::numeric_limits<unsigned_long>::max();
  while( true ) {
    indent = (string *)0x0;
    filename.field_2._12_4_ = getopt_long(argc,argv,"hl:o:",main::long_options);
    if (filename.field_2._12_4_ == -1) break;
    if (filename.field_2._12_4_ == 0x68) {
      anon_unknown.dwarf_56ca::print_help();
      return 0;
    }
    if (filename.field_2._12_4_ == 0x6c) {
      _remaining_args = atoll(_optarg);
    }
    else {
      if (filename.field_2._12_4_ != 0x6f) {
        return 1;
      }
      length = atoll(_optarg);
    }
  }
  filename.field_2._8_4_ = argc - _optind;
  if (filename.field_2._8_4_ == 1) {
    pcVar4 = argv[_optind];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,pcVar4,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"-");
    if (bVar1) {
      (anonymous_namespace)::read_from_stdin_abi_cxx11_();
    }
    else {
      (anonymous_namespace)::read_from_file_abi_cxx11_
                ((string *)local_88,(_anonymous_namespace_ *)argv[_optind],filename_00);
    }
    uVar3 = std::__cxx11::string::size();
    if (uVar3 < length) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"offset is larger than file size");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (length != 0) {
      std::__cxx11::string::erase((ulong)local_88,0);
    }
    uVar3 = std::__cxx11::string::size();
    if (_remaining_args < uVar3) {
      std::__cxx11::string::resize((ulong)local_88);
    }
    this_00 = (anon_unknown_dwarf_56ca *)std::__cxx11::string::data();
    pcVar4 = (char *)std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"",(allocator *)((long)&ex + 7));
    anon_unknown.dwarf_56ca::decode(&local_a8,this_00,pcVar4,(size_t)local_c8,indent);
    std::operator<<((ostream *)&std::cout,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ex + 7));
    std::__cxx11::string::~string((string *)local_88);
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," [OPTIONS] [INPUT_FILE]\n\n");
    std::operator<<(poVar2,"Call with --help/-h to see options.\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    static struct option long_options[] = {
        {"help",         no_argument, nullptr, 'h'},
        {"length", required_argument, nullptr, 'l'},
        {"offset", required_argument, nullptr, 'o'},
        {nullptr, 0, nullptr, 0}
    };

    std::size_t offset = 0;
    std::size_t length = std::numeric_limits<std::size_t>::max();

    while (true) {
        const int c = getopt_long(argc, argv, "hl:o:", long_options, nullptr); // NOLINT(concurrency-mt-unsafe) no threads here
        if (c == -1) {
            break;
        }

        switch (c) {
            case 'h':
                print_help();
                return 0;
            case 'l':
                length = std::atoll(optarg); // NOLINT(cert-err34-c)
                                             // good enough for a limited-use tool
                break;
            case 'o':
                offset = std::atoll(optarg); // NOLINT(cert-err34-c)
                                             // good enough for a limited-use tool
                break;
            default:
                return 1;
        }
    }

    const int remaining_args = argc - optind;
    if (remaining_args != 1) {
        std::cerr << "Usage: " << argv[0] << " [OPTIONS] [INPUT_FILE]\n\n"
                  << "Call with --help/-h to see options.\n";
        return 1;
    }

    const std::string filename{argv[optind]};

    try {
        std::string buffer{filename == "-" ? read_from_stdin() :
                                             read_from_file(argv[optind])};

        if (offset > buffer.size()) {
            throw std::runtime_error{"offset is larger than file size"};
        }

        if (offset > 0) {
            buffer.erase(0, offset);
        }

        if (length < buffer.size()) {
            buffer.resize(length);
        }

        std::cout << decode(buffer.data(), buffer.size(), "");
    } catch (const std::exception& ex) {
        std::cerr << ex.what() << '\n';
        return 1;
    }

    return 0;
}